

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_4.cpp
# Opt level: O0

optional<int> parse_and_evaluate(string *_expression)

{
  _Storage<Operator,_true> _Var1;
  optional<int> oVar2;
  bool bVar3;
  Operator *pOVar4;
  _Optional_base<int,_true,_true> _Var5;
  ostream *poVar6;
  int *piVar7;
  _Optional_payload_base<int> local_40;
  optional<int> rhs;
  optional<Operator> op;
  number_type result;
  optional<int> first_value;
  size_t parseOffset;
  string *_expression_local;
  
  first_value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_payload<int,_true,_true,_true>)0x0;
  _result = (_Optional_payload_base<int>)parse_number(_expression,(size_t *)&first_value);
  bVar3 = std::optional<int>::has_value((optional<int> *)&result);
  if (bVar3) {
    pOVar4 = (Operator *)std::optional<int>::value((optional<int> *)&result);
    op.super__Optional_base<Operator,_true,_true>._M_payload.super__Optional_payload_base<Operator>.
    _M_payload._M_value = *pOVar4;
    while (oVar2.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
                = first_value.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int>,
          _Var5._M_payload.super__Optional_payload_base<int> =
               (_Optional_payload<int,_true,_true,_true>)std::__cxx11::string::size(),
          (ulong)oVar2.super__Optional_base<int,_true,_true>._M_payload.
                 super__Optional_payload_base<int> <
          (ulong)_Var5._M_payload.super__Optional_payload_base<int>) {
      rhs.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
           (_Optional_base<int,_true,_true>)parse_operator(_expression,(size_t *)&first_value);
      bVar3 = std::optional<Operator>::has_value((optional<Operator> *)&rhs);
      if (!bVar3) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Failed to parse operator at offset: ");
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           (poVar6,(ulong)first_value.super__Optional_base<int,_true,_true>.
                                          _M_payload.super__Optional_payload_base<int>);
        std::operator<<(poVar6,'\n');
        break;
      }
      local_40 = (_Optional_payload_base<int>)parse_number(_expression,(size_t *)&first_value);
      bVar3 = std::optional<int>::has_value((optional<int> *)&local_40);
      if (!bVar3) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Failed to parse next operand at offset ");
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           (poVar6,(ulong)first_value.super__Optional_base<int,_true,_true>.
                                          _M_payload.super__Optional_payload_base<int>);
        std::operator<<(poVar6,'\n');
        std::optional<int>::optional((optional<int> *)&_expression_local);
        return (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)_expression_local;
      }
      pOVar4 = std::optional<Operator>::value((optional<Operator> *)&rhs);
      _Var1 = op.super__Optional_base<Operator,_true,_true>._M_payload.
              super__Optional_payload_base<Operator>._M_payload;
      switch(*pOVar4) {
      case Plus:
        piVar7 = std::optional<int>::value((optional<int> *)&local_40);
        op.super__Optional_base<Operator,_true,_true>._M_payload.
        super__Optional_payload_base<Operator>._M_payload._M_value = _Var1._M_value + *piVar7;
        break;
      case Minus:
        piVar7 = std::optional<int>::value((optional<int> *)&local_40);
        op.super__Optional_base<Operator,_true,_true>._M_payload.
        super__Optional_payload_base<Operator>._M_payload._M_value = _Var1._M_value - *piVar7;
        break;
      case Multiply:
        piVar7 = std::optional<int>::value((optional<int> *)&local_40);
        op.super__Optional_base<Operator,_true,_true>._M_payload.
        super__Optional_payload_base<Operator>._M_payload._M_value = _Var1._M_value * *piVar7;
        break;
      case Divide:
        piVar7 = std::optional<int>::value((optional<int> *)&local_40);
        _Var1 = op.super__Optional_base<Operator,_true,_true>._M_payload.
                super__Optional_payload_base<Operator>._M_payload;
        if (*piVar7 == 0) {
          std::operator<<((ostream *)&std::cerr,"Division by zero is undefined.\n");
          std::optional<int>::optional((optional<int> *)&_expression_local);
          return (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)_expression_local
          ;
        }
        piVar7 = std::optional<int>::value((optional<int> *)&local_40);
        op.super__Optional_base<Operator,_true,_true>._M_payload.
        super__Optional_payload_base<Operator>._M_payload._M_value = _Var1._M_value / *piVar7;
      }
    }
    std::optional<int>::optional<int,_true>((optional<int> *)&_expression_local,(int *)&op);
  }
  else {
    std::operator<<((ostream *)&std::cerr,"Could not parse first number.\n");
    std::optional<int>::optional((optional<int> *)&_expression_local);
  }
  return (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)_expression_local;
}

Assistant:

optional<number_type> parse_and_evaluate(string const& _expression)
{
	size_t parseOffset = 0;
	optional<number_type> const first_value = parse_number(_expression, parseOffset);
	if (!first_value.has_value())
	{
		cerr << "Could not parse first number.\n";
		return nullopt;
	}

	number_type result = first_value.value();

	while (parseOffset < _expression.size())
	{
		optional<Operator> const op = parse_operator(_expression, parseOffset);
		if (!op.has_value())
		{
			cerr << "Failed to parse operator at offset: " << parseOffset << '\n';
			break;
		}

		optional<number_type> const rhs = parse_number(_expression, parseOffset);
		if (!rhs.has_value())
		{
			cerr << "Failed to parse next operand at offset " << parseOffset << '\n';
			return nullopt;
		}

		switch (op.value())
		{
			case Operator::Plus:
				result = result + rhs.value();
				break;
			case Operator::Minus:
				result = result - rhs.value();
				break;
			case Operator::Multiply:
				result = result * rhs.value();
				break;
			case Operator::Divide:
				if (rhs.value() != 0)
					result = result / rhs.value();
				else
				{
					cerr << "Division by zero is undefined.\n";
					return nullopt;
				}
				break;
		}
	}
	return result;
}